

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

char * ToStringHelper(uint *a,uint count,char *dst_str,char *dst_str_end)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  pcVar3 = (char *)0x0;
  if (dst_str < dst_str_end && dst_str != (char *)0x0) {
    lVar2 = 0;
    do {
      dst_str[lVar2] = " angle = ["[lVar2 + 9];
      if (lVar2 == 1) {
        pcVar3 = dst_str + 1;
        break;
      }
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (dst_str + lVar1 != dst_str_end);
  }
  pcVar3 = ToStringHelper(count,pcVar3,dst_str_end);
  if (pcVar3 < dst_str_end && pcVar3 != (char *)0x0) {
    pcVar4 = (char *)0x0;
    lVar2 = 0;
    do {
      pcVar3[lVar2] = "]="[lVar2];
      if (lVar2 == 2) {
        pcVar4 = pcVar3 + 2;
        break;
      }
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (pcVar3 + lVar1 != dst_str_end);
  }
  else {
    pcVar4 = (char *)0x0;
  }
  if (a == (uint *)0x0) {
    if (dst_str_end > pcVar4 && pcVar4 != (char *)0x0) {
      lVar2 = 0;
      do {
        pcVar4[lVar2] = "Stream cannot be null"[lVar2 + 0x11];
        if (lVar2 == 4) {
          return pcVar4 + 4;
        }
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (pcVar4 + lVar1 != dst_str_end);
      return (char *)0x0;
    }
  }
  else {
    if (dst_str_end <= pcVar4 || pcVar4 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = (char *)0x0;
      lVar2 = 0;
      do {
        pcVar4[lVar2] = ") ("[lVar2 + 2];
        if (lVar2 == 1) {
          pcVar3 = pcVar4 + 1;
          break;
        }
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (pcVar4 + lVar1 != dst_str_end);
    }
    if (count == 0xffffffff) {
      if (pcVar3 < dst_str_end && pcVar3 != (char *)0x0) {
        lVar2 = 0;
        do {
          pcVar3[lVar2] = "Newton-Raphson failed to converge.  Is your function C2?"[lVar2 + 0x37];
          if (lVar2 == 1) {
            pcVar3 = pcVar3 + 1;
            goto LAB_00532fcb;
          }
          lVar1 = lVar2 + 1;
          lVar2 = lVar2 + 1;
        } while (pcVar3 + lVar1 != dst_str_end);
      }
      pcVar3 = (char *)0x0;
    }
    else {
      uVar5 = 4;
      if (count < 8) {
        uVar5 = (ulong)count;
      }
      if ((int)uVar5 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (uVar6 != 0) {
            if (pcVar3 < dst_str_end && pcVar3 != (char *)0x0) {
              lVar2 = 0;
              do {
                pcVar3[lVar2] = ",...,"[lVar2 + 4];
                if (lVar2 == 1) {
                  pcVar3 = pcVar3 + 1;
                  goto LAB_00532f14;
                }
                lVar1 = lVar2 + 1;
                lVar2 = lVar2 + 1;
              } while (pcVar3 + lVar1 != dst_str_end);
            }
            pcVar3 = (char *)0x0;
          }
LAB_00532f14:
          pcVar3 = ToStringHelper(a[uVar6],pcVar3,dst_str_end);
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar5);
      }
      if ((uint)uVar6 < count) {
        pcVar4 = (char *)0x0;
        if (pcVar3 < dst_str_end && pcVar3 != (char *)0x0) {
          lVar2 = 0;
          do {
            pcVar3[lVar2] = ",...,"[lVar2];
            if (lVar2 == 5) {
              pcVar4 = pcVar3 + 5;
              break;
            }
            lVar1 = lVar2 + 1;
            lVar2 = lVar2 + 1;
          } while (pcVar3 + lVar1 != dst_str_end);
        }
        pcVar3 = ToStringHelper(a[count - 1],pcVar4,dst_str_end);
      }
    }
LAB_00532fcb:
    if (pcVar3 < dst_str_end && pcVar3 != (char *)0x0) {
      lVar2 = 0;
      do {
        pcVar3[lVar2] = "0 = ON_Mesh::Cast( Owner() )"[lVar2 + 0x1b];
        if (lVar2 == 1) {
          return pcVar3 + 1;
        }
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (pcVar3 + lVar1 != dst_str_end);
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

static char* ToStringHelper( const unsigned int* a, unsigned int count, char* dst_str, const char* dst_str_end )
{
  unsigned int i, imax;

  dst_str = ToStringHelper("[",dst_str,dst_str_end);
  dst_str = ToStringHelper(count,dst_str,dst_str_end);
  dst_str = ToStringHelper("]=",dst_str,dst_str_end);
  if ( 0 == a )
    dst_str = ToStringHelper("null",dst_str,dst_str_end);
  else
  {
    dst_str = ToStringHelper("(",dst_str,dst_str_end);
    if ( ON_UNSET_UINT_INDEX == count )
    {
      dst_str = ToStringHelper("?",dst_str,dst_str_end);
    }
    else
    {
      imax = (count <= 7 ? count : 4 );
      for ( i = 0; i < imax; i++ )
      {
        if ( i )
          dst_str = ToStringHelper(",",dst_str,dst_str_end);
        dst_str = ToStringHelper(a[i],dst_str,dst_str_end);
      }
      if ( i < count )
      {
        dst_str = ToStringHelper(",...,",dst_str,dst_str_end);
        dst_str = ToStringHelper(a[count-1],dst_str,dst_str_end);
      }
    }
    dst_str = ToStringHelper(")",dst_str,dst_str_end);
  }

  return dst_str;
}